

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.cpp
# Opt level: O1

void __thiscall ANTLRException::ANTLRException(ANTLRException *this,string *s)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__ANTLRException_00243660;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + s->_M_string_length);
  return;
}

Assistant:

ANTLRException::ANTLRException(const std::string& s)
: text(s)
{}